

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O2

void mbedtls_ssl_print_extension
               (mbedtls_ssl_context *ssl,int level,char *file,int line,int hs_msg_type,
               uint extension_type,char *extra_msg0,char *extra_msg1)

{
  char *pcVar1;
  char *pcVar2;
  char *format;
  
  if (extra_msg1 == (char *)0x0 || extra_msg0 == (char *)0x0) {
    if (extra_msg0 != (char *)0x0) {
      extra_msg1 = extra_msg0;
    }
    pcVar1 = ssl_tls13_get_hs_msg_name(hs_msg_type);
    pcVar2 = mbedtls_ssl_get_extension_name(extension_type);
    if (extra_msg1 == (char *)0x0) {
      mbedtls_debug_print_msg
                (ssl,level,file,line,"%s: %s(%u) extension.",pcVar1,pcVar2,(ulong)extension_type);
      return;
    }
    format = "%s: %s(%u) extension %s.";
    extra_msg0 = extra_msg1;
  }
  else {
    pcVar1 = ssl_tls13_get_hs_msg_name(hs_msg_type);
    pcVar2 = mbedtls_ssl_get_extension_name(extension_type);
    format = "%s: %s(%u) extension %s %s.";
  }
  mbedtls_debug_print_msg(ssl,level,file,line,format,pcVar1,pcVar2,(ulong)extension_type,extra_msg0)
  ;
  return;
}

Assistant:

void mbedtls_ssl_print_extension(const mbedtls_ssl_context *ssl,
                                 int level, const char *file, int line,
                                 int hs_msg_type, unsigned int extension_type,
                                 const char *extra_msg0, const char *extra_msg1)
{
    const char *extra_msg;
    if (extra_msg0 && extra_msg1) {
        mbedtls_debug_print_msg(
            ssl, level, file, line,
            "%s: %s(%u) extension %s %s.",
            ssl_tls13_get_hs_msg_name(hs_msg_type),
            mbedtls_ssl_get_extension_name(extension_type),
            extension_type,
            extra_msg0, extra_msg1);
        return;
    }

    extra_msg = extra_msg0 ? extra_msg0 : extra_msg1;
    if (extra_msg) {
        mbedtls_debug_print_msg(
            ssl, level, file, line,
            "%s: %s(%u) extension %s.", ssl_tls13_get_hs_msg_name(hs_msg_type),
            mbedtls_ssl_get_extension_name(extension_type), extension_type,
            extra_msg);
        return;
    }

    mbedtls_debug_print_msg(
        ssl, level, file, line,
        "%s: %s(%u) extension.", ssl_tls13_get_hs_msg_name(hs_msg_type),
        mbedtls_ssl_get_extension_name(extension_type), extension_type);
}